

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.hh
# Opt level: O0

void __thiscall
tchecker::
variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::declare(variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,uint id,string *name,clock_info_t *info)

{
  invalid_argument *this_00;
  exception *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pair<unsigned_int,_tchecker::clock_info_t> local_58;
  flat_map<unsigned_int,_tchecker::clock_info_t,_std::less<unsigned_int>,_void> local_50;
  bool *ok;
  clock_info_t *local_28;
  clock_info_t *info_local;
  string *name_local;
  variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_10;
  uint id_local;
  variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  local_28 = info;
  info_local = (clock_info_t *)name;
  name_local._4_4_ = id;
  pvStack_10 = this;
  index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add(&this->_index,(uint *)((long)&name_local + 4),name);
  local_58 = std::make_pair<unsigned_int&,tchecker::clock_info_t_const&>
                       ((uint *)((long)&name_local + 4),local_28);
  boost::container::flat_map<unsigned_int,_tchecker::clock_info_t,_std::less<unsigned_int>,_void>::
  insert(&local_50,(value_type *)&this->_info);
  local_50.m_flat_tree.m_data.m_seq.m_holder.m_capacity =
       (stored_size_type)&local_50.m_flat_tree.m_data.m_seq.m_holder.m_size;
  if (((byte)local_50.m_flat_tree.m_data.m_seq.m_holder.m_size & 1) == 0) {
    index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::erase(&this->_index,(uint *)((long)&name_local + 4));
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_98,"Variable ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)info_local);
    std::operator+(&local_78,&local_98," cannot be declared");
    std::invalid_argument::invalid_argument(this_00,(string *)&local_78);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

void declare(ID id, std::string const & name, INFO const & info)
  {
    try {
      _index.add(id, name);
      auto && ok = _info.insert(std::make_pair(id, info)).second;
      if (!ok) {
        _index.erase(id);
        throw std::invalid_argument("Variable " + name + " cannot be declared");
      }
    }
    catch (std::exception const & e) {
      throw std::invalid_argument("Variable " + name + " cannot be declared");
    }
  }